

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

Result file_write(char *filename,FileData *file_data)

{
  FILE *__s;
  size_t sVar1;
  
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",0x3c);
    fprintf(_stderr,"unable to open file \"%s\".\n",filename);
  }
  else {
    sVar1 = fwrite(file_data->data,file_data->size,1,__s);
    if (sVar1 == 1) {
      fclose(__s);
      return OK;
    }
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/common.c",0x3e);
    fwrite("fwrite failed.\n",0xf,1,_stderr);
    fclose(__s);
  }
  return ERROR;
}

Assistant:

Result file_write(const char* filename, const FileData* file_data) {
  FILE* f = fopen(filename, "wb");
  CHECK_MSG(f, "unable to open file \"%s\".\n", filename);
  CHECK_MSG(fwrite(file_data->data, file_data->size, 1, f) == 1,
            "fwrite failed.\n");
  fclose(f);
  return OK;
  ON_ERROR_CLOSE_FILE_AND_RETURN;
}